

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  initializer_list<float> __l;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int jSquare;
  int iVar11;
  int i_00;
  int j_00;
  parameter *ppVar12;
  man_page *man;
  ostream *poVar13;
  HgtFilesGrid *this;
  char *pcVar14;
  ulong uVar15;
  FILE *__s;
  void *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tgts;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  __type _Var20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_2260;
  double local_2258;
  double local_2250;
  vec_t local_2230;
  vec_t local_2218;
  int local_201c;
  int i_1;
  float *quadHeightData_fl;
  string fileName;
  string zoomDir;
  FILE *fp;
  char ccn [10];
  vec_t h;
  vec_t edge;
  vec_t h11;
  vec_t cornerLon;
  vec_t cornerLat;
  vec_t h10;
  vec_t h01;
  vec_t h00;
  int j00;
  int i00;
  int indLat;
  vec_t onedlon;
  vec_t onedlat;
  int demFileIndex_j;
  int demFileIndex_i;
  int j;
  int i;
  uint uStack_1f3c;
  bool isZeroHeight;
  int qn;
  int qm;
  double coordj;
  double coordi;
  double lat_d;
  double lon_d;
  vec3_t line [2];
  vec3_t tr [3];
  vec_t *quadHeightData;
  undefined1 local_1e90 [4];
  int quadSize2;
  HgtFormat dstField;
  HgtFormat srcField;
  HgtFormat srcHgtFormat;
  HgtFilesGrid *demGrid;
  int qn_end_in_grid;
  int qn_start_in_grid;
  int qm_end_in_grid;
  int qm_start_in_grid;
  int dstFieldSize;
  int quadsCount;
  int qm_end;
  int qm_start;
  int qn_end;
  int qn_start;
  string local_1e28;
  allocator<char> local_1e01;
  string local_1e00;
  doc_formatting local_1de0;
  allocator<char> local_1b31;
  doc_string local_1b30;
  man_page local_1b10;
  parsing_result local_1ad0;
  allocator<char> local_1a99;
  string local_1a98 [32];
  parameter local_1a78;
  allocator<char> local_1971;
  doc_string local_1970;
  parameter local_1950;
  parameter local_1850;
  group local_1750;
  allocator<char> local_1701;
  string local_1700 [32];
  parameter local_16e0;
  allocator<char> local_15d9;
  string local_15d8 [32];
  parameter local_15b8;
  allocator<char> local_14b1;
  doc_string local_14b0;
  parameter local_1490;
  parameter local_1390;
  group local_1290;
  group local_1248;
  allocator<char> local_11f9;
  string local_11f8 [32];
  parameter local_11d8;
  allocator<char> local_10d1;
  string local_10d0 [32];
  parameter local_10b0;
  allocator<char> local_fa9;
  doc_string local_fa8;
  parameter local_f88;
  parameter local_e88;
  group local_d88;
  group local_d40;
  allocator<char> local_cf1;
  string local_cf0 [32];
  parameter local_cd0;
  allocator<char> local_bc9;
  doc_string local_bc8;
  parameter local_ba8;
  parameter local_aa8;
  group local_9a8;
  allocator<char> local_959;
  string local_958 [32];
  parameter local_938;
  allocator<char> local_831;
  doc_string local_830;
  parameter local_810;
  parameter local_710;
  group local_610;
  allocator<char> local_5c1;
  string local_5c0 [32];
  parameter local_5a0;
  allocator<char> local_499;
  doc_string local_498;
  parameter local_478;
  parameter local_378;
  group local_278;
  group local_230;
  group local_1e8;
  group local_1a0;
  group local_158;
  undefined1 local_110 [8];
  group cli;
  vec_t incLon_merc;
  vec_t incLat_merc;
  undefined1 local_a1;
  float local_a0 [2];
  iterator local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  vector<float,_std::allocator<float>_> bottomrightlonlat;
  float bottomrightlat;
  float bottomrightlon;
  float topleftlat;
  float topleftlon;
  int quadSize;
  int zoom;
  string inputdir;
  string outputdir;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(inputdir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&quadSize);
  topleftlon = 1.54143e-44;
  topleftlat = 4.62428e-44;
  bottomrightlon = -180.0;
  bottomrightlat = 85.0;
  bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 180.0;
  bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
  local_a0[0] = 180.0;
  local_a0[1] = 0.0;
  local_98 = local_a0;
  local_90 = 2;
  tgts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a1;
  std::allocator<float>::allocator((allocator<float> *)tgts);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_88,__l,(allocator_type *)tgts);
  std::allocator<float>::~allocator((allocator<float> *)&local_a1);
  clipp::required<char_const(&)[3],char_const(&)[12]>
            (&local_478,(clipp *)"-o",(char (*) [3])"--outputdir",(char (*) [12])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"output directory root",&local_499);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_478.super_token<clipp::parameter>,&local_498);
  clipp::parameter::parameter(&local_378,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"outputdir",&local_5c1);
  clipp::value<std::__cxx11::string&>
            (&local_5a0,(clipp *)local_5c0,(doc_string *)((long)&inputdir.field_2 + 8),tgts);
  clipp::operator&(&local_278,&local_378,&local_5a0);
  clipp::required<char_const(&)[3],char_const(&)[11]>
            (&local_810,(clipp *)"-i",(char (*) [3])"--inputdir",(char (*) [11])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,
             "input directory containing hgt files from \t\t\thttp://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm"
             ,&local_831);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_810.super_token<clipp::parameter>,&local_830);
  clipp::parameter::parameter(&local_710,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_958,"inputdir",&local_959);
  clipp::value<std::__cxx11::string&>(&local_938,(clipp *)local_958,(doc_string *)&quadSize,tgts);
  clipp::operator&(&local_610,&local_710,&local_938);
  clipp::operator_(&local_230,&local_278,&local_610);
  clipp::option<char_const(&)[3],char_const(&)[12]>
            (&local_ba8,(clipp *)"-z",(char (*) [3])"--zoomlevel",(char (*) [12])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"target zoom level",&local_bc9);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_ba8.super_token<clipp::parameter>,&local_bc8);
  clipp::parameter::parameter(&local_aa8,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cf0,"zoom",&local_cf1);
  clipp::value<int&>(&local_cd0,(clipp *)local_cf0,(doc_string *)&topleftlon,(int *)tgts);
  clipp::operator&(&local_9a8,&local_aa8,&local_cd0);
  clipp::operator_(&local_1e8,&local_230,&local_9a8);
  clipp::option<char_const(&)[3],char_const(&)[8]>
            (&local_f88,(clipp *)"-s",(char (*) [3])"--start",(char (*) [8])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Start lon lat coordonates",&local_fa9);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_f88.super_token<clipp::parameter>,&local_fa8);
  clipp::parameter::parameter(&local_e88,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10d0,"lon",&local_10d1);
  clipp::value<float&>(&local_10b0,(clipp *)local_10d0,(doc_string *)&bottomrightlon,(float *)tgts);
  clipp::operator&(&local_d88,&local_e88,&local_10b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11f8,"lat",&local_11f9);
  clipp::value<float&>(&local_11d8,(clipp *)local_11f8,(doc_string *)&bottomrightlat,(float *)tgts);
  clipp::operator&(&local_d40,&local_d88,&local_11d8);
  clipp::operator_(&local_1a0,&local_1e8,&local_d40);
  clipp::option<char_const(&)[3],char_const(&)[6]>
            (&local_1490,(clipp *)"-e",(char (*) [3])"--end",(char (*) [6])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14b0,"End lon lat coordonates",&local_14b1);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_1490.super_token<clipp::parameter>,&local_14b0);
  clipp::parameter::parameter(&local_1390,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_15d8,"lon",&local_15d9);
  clipp::value<float&>
            (&local_15b8,(clipp *)local_15d8,
             (doc_string *)
             ((long)&bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),(float *)tgts);
  clipp::operator&(&local_1290,&local_1390,&local_15b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1700,"lat",&local_1701);
  clipp::value<float&>
            (&local_16e0,(clipp *)local_1700,
             (doc_string *)
             &bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(float *)tgts);
  clipp::operator&(&local_1248,&local_1290,&local_16e0);
  clipp::operator_(&local_158,&local_1a0,&local_1248);
  clipp::option<char_const(&)[3],char_const(&)[11]>
            (&local_1950,(clipp *)"-x",(char (*) [3])"--quadsize",(char (*) [11])tgts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1970,"Quadsize resolution default 33",&local_1971);
  ppVar12 = clipp::detail::token<clipp::parameter>::doc
                      (&local_1950.super_token<clipp::parameter>,&local_1970);
  clipp::parameter::parameter(&local_1850,ppVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a98,"size",&local_1a99);
  clipp::value<int&>(&local_1a78,(clipp *)local_1a98,(doc_string *)&topleftlat,(int *)tgts);
  clipp::operator&(&local_1750,&local_1850,&local_1a78);
  clipp::operator_((group *)local_110,&local_158,&local_1750);
  clipp::group::~group(&local_1750);
  clipp::parameter::~parameter(&local_1a78);
  std::__cxx11::string::~string(local_1a98);
  std::allocator<char>::~allocator(&local_1a99);
  clipp::parameter::~parameter(&local_1850);
  std::__cxx11::string::~string((string *)&local_1970);
  std::allocator<char>::~allocator(&local_1971);
  clipp::parameter::~parameter(&local_1950);
  clipp::group::~group(&local_158);
  clipp::group::~group(&local_1248);
  clipp::parameter::~parameter(&local_16e0);
  std::__cxx11::string::~string(local_1700);
  std::allocator<char>::~allocator(&local_1701);
  clipp::group::~group(&local_1290);
  clipp::parameter::~parameter(&local_15b8);
  std::__cxx11::string::~string(local_15d8);
  std::allocator<char>::~allocator(&local_15d9);
  clipp::parameter::~parameter(&local_1390);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::allocator<char>::~allocator(&local_14b1);
  clipp::parameter::~parameter(&local_1490);
  clipp::group::~group(&local_1a0);
  clipp::group::~group(&local_d40);
  clipp::parameter::~parameter(&local_11d8);
  std::__cxx11::string::~string(local_11f8);
  std::allocator<char>::~allocator(&local_11f9);
  clipp::group::~group(&local_d88);
  clipp::parameter::~parameter(&local_10b0);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  clipp::parameter::~parameter(&local_e88);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  clipp::parameter::~parameter(&local_f88);
  clipp::group::~group(&local_1e8);
  clipp::group::~group(&local_9a8);
  clipp::parameter::~parameter(&local_cd0);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator(&local_cf1);
  clipp::parameter::~parameter(&local_aa8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  clipp::parameter::~parameter(&local_ba8);
  clipp::group::~group(&local_230);
  clipp::group::~group(&local_610);
  clipp::parameter::~parameter(&local_938);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  clipp::parameter::~parameter(&local_710);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  clipp::parameter::~parameter(&local_810);
  clipp::group::~group(&local_278);
  clipp::parameter::~parameter(&local_5a0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  clipp::parameter::~parameter(&local_378);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  clipp::parameter::~parameter(&local_478);
  clipp::parse(&local_1ad0,argc,argv,(group *)local_110,1);
  bVar3 = clipp::parsing_result::operator_cast_to_bool(&local_1ad0);
  clipp::parsing_result::~parsing_result(&local_1ad0);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    poVar13 = std::operator<<((ostream *)&std::cout,"zoom: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)topleftlon);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cout,"topleftlonlat: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,bottomrightlon);
    poVar13 = std::operator<<(poVar13,"|");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,bottomrightlat);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cout,"bottomrightlonlat: ");
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (poVar13,bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar13 = std::operator<<(poVar13,"|");
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (poVar13,bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cout,"quadsize: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)topleftlat);
    std::operator<<(poVar13,"\n");
    dVar16 = Lon2Merc((double)bottomrightlon);
    dVar17 = Lon2Merc((double)bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar18 = Lat2Merc((double)bottomrightlat);
    dVar19 = Lat2Merc((double)bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    _Var20 = std::pow<int,int>(2,(int)topleftlon);
    iVar5 = (int)_Var20;
    iVar6 = iVar5 * ((int)topleftlat + -1);
    iVar7 = iVar6 + 1;
    dVar21 = 40075016.68 / (double)iVar6;
    iVar6 = (int)((20037508.34 - (double)(int)dVar18) / (dVar21 * (double)((int)topleftlat + -1)));
    iVar8 = (int)((20037508.34 - (double)(int)dVar19) / (dVar21 * (double)((int)topleftlat + -1)));
    iVar9 = (int)topleftlat + -1;
    iVar10 = (int)topleftlat + -1;
    cli._64_8_ = dVar21;
    poVar13 = std::operator<<((ostream *)&std::cout,"qm_start_in_grid: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar6);
    poVar13 = std::operator<<(poVar13,"<->");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar8);
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cout,"qn_start_in_grid: ");
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (poVar13,(int)(((double)(int)dVar16 - 20037508.34) /
                                      (dVar21 * (double)iVar9)));
    poVar13 = std::operator<<(poVar13,"<->");
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (poVar13,(int)(((double)(int)dVar17 - 20037508.34) /
                                      (dVar21 * (double)iVar10)));
    std::operator<<(poVar13,"\n");
    this = (HgtFilesGrid *)operator_new(0x17edc8);
    HgtFilesGrid::HgtFilesGrid(this);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    HgtFilesGrid::Init(this,4,pcVar14);
    HgtFormat::HgtFormat((HgtFormat *)&srcField.cellsize,0x4b1,0x4b1,0.0008333333333333334);
    HgtFormat::HgtFormat
              ((HgtFormat *)&dstField.cellsize,srcField.cellsize._4_4_ * 0xb4 + -0xb3,
               srcField.cellsize._0_4_ * 0x168 + -0x167,0.0);
    HgtFormat::HgtFormat((HgtFormat *)local_1e90,iVar7,iVar7,0.0);
    iVar7 = (int)topleftlat * (int)topleftlat;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar7;
    uVar15 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar15 = 0xffffffffffffffff;
    }
    tr[2][2] = (vec_t)operator_new__(uVar15);
    vecSet(&lon_d,0.0,1000000.0,0.0);
    vecSet(line[0] + 2,0.0,-1000000.0,0.0);
    for (uStack_1f3c = 0; (int)uStack_1f3c < iVar5; uStack_1f3c = uStack_1f3c + 1) {
      if ((iVar6 <= (int)uStack_1f3c) && ((int)uStack_1f3c <= iVar8)) {
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uStack_1f3c);
        poVar13 = std::operator<<(poVar13,"/");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar5);
        std::operator<<(poVar13,"\n");
        for (i = 0; i < iVar5; i = i + 1) {
          bVar3 = true;
          for (demFileIndex_i = 0; demFileIndex_i < (int)topleftlat;
              demFileIndex_i = demFileIndex_i + 1) {
            for (demFileIndex_j = 0; demFileIndex_j < (int)topleftlat;
                demFileIndex_j = demFileIndex_j + 1) {
              dVar16 = (double)(((int)topleftlat + -1) * i + demFileIndex_j) * (double)cli._64_8_;
              dVar17 = Merc2Lat(-(double)(int)(((int)topleftlat + -1) * uStack_1f3c + demFileIndex_i
                                              ) * dVar21 + 20037508.34);
              dVar16 = Merc2Lon(dVar16 + -20037508.34);
              if ((((i == 0) && (demFileIndex_i == 0)) && (demFileIndex_j == 0)) ||
                 (((i == iVar5 + -1 && (demFileIndex_i == (int)topleftlat + -1)) &&
                  (demFileIndex_j == (int)topleftlat + -1)))) {
                poVar13 = std::operator<<((ostream *)&std::cout,"    lon: ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,dVar16);
                poVar13 = std::operator<<(poVar13," lat: ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,dVar17);
                std::operator<<(poVar13,"\n");
              }
              dVar18 = ceil(90.0 - dVar17);
              iVar10 = (int)dVar18;
              dVar18 = floor(dVar16 + 180.0);
              jSquare = (int)dVar18;
              dVar18 = DegTail(dVar17);
              dVar19 = DegTail(dVar16);
              dVar18 = floor(dVar18 / (double)srcHgtFormat._0_8_);
              iVar11 = (int)dVar18;
              iVar9 = -iVar11;
              i_00 = iVar9 + 0x4af;
              dVar18 = floor(dVar19 / (double)srcHgtFormat._0_8_);
              j_00 = (int)dVar18;
              sVar4 = HgtFilesGrid::GetHeight(this,iVar10,jSquare,i_00,j_00);
              dVar18 = (double)(int)sVar4;
              sVar4 = HgtFilesGrid::GetHeight(this,iVar10,jSquare,i_00,j_00 + 1);
              dVar19 = (double)(int)sVar4;
              sVar4 = HgtFilesGrid::GetHeight(this,iVar10,jSquare,iVar9 + 0x4b0,j_00);
              dVar22 = (double)(int)sVar4;
              dVar23 = (double)(0x5a - iVar10);
              dVar24 = (double)(jSquare + -0xb4);
              vecSet(line[1] + 2,(double)j_00 * (double)srcHgtFormat._0_8_ + dVar24,dVar18,
                     (double)(iVar11 + 1) * (double)srcHgtFormat._0_8_ + dVar23);
              local_2218 = dVar18;
              if (j_00 < srcField.cellsize._0_4_ + -1) {
                local_2218 = dVar19;
              }
              vecSet(tr[1] + 2,(double)(j_00 + 1) * (double)srcHgtFormat._0_8_ + dVar24,local_2218,
                     (double)(iVar11 + 1) * (double)srcHgtFormat._0_8_ + dVar23);
              local_2230 = dVar18;
              if (i_00 < srcField.cellsize._4_4_ + -1) {
                local_2230 = dVar22;
              }
              vecSet(tr[0] + 2,(double)j_00 * (double)srcHgtFormat._0_8_ + dVar24,local_2230,
                     (double)iVar11 * (double)srcHgtFormat._0_8_ + dVar23);
              edge = 0.0;
              lon_d = dVar16;
              line[0][1] = dVar17;
              line[0][2] = dVar16;
              line[1][1] = dVar17;
              if ((dVar16 - tr[1][2]) * (tr[1][1] - tr[2][1]) +
                  -((dVar17 - tr[2][1]) * (tr[0][2] - tr[1][2])) < 0.0) {
                sVar4 = HgtFilesGrid::GetHeight(this,iVar10,jSquare,iVar9 + 0x4b0,j_00 + 1);
                edge = (vec_t)(int)sVar4;
                if ((srcField.cellsize._4_4_ + -1 <= i_00) ||
                   (local_2250 = edge, srcField.cellsize._0_4_ + -1 <= j_00)) {
                  local_2258 = dVar22;
                  if (srcField.cellsize._4_4_ + -1 <= i_00) {
                    local_2260 = dVar18;
                    if (j_00 < srcField.cellsize._4_4_ + -1) {
                      local_2260 = dVar19;
                    }
                    local_2258 = local_2260;
                  }
                  local_2250 = local_2258;
                }
                vecSet(line[1] + 2,(double)(j_00 + 1) * (double)srcHgtFormat._0_8_ + dVar24,
                       local_2250,(double)iVar11 * (double)srcHgtFormat._0_8_ + dVar23);
              }
              *(undefined8 *)
               ((long)tr[2][2] + (long)(demFileIndex_i * (int)topleftlat + demFileIndex_j) * 8) = 0;
              if (((((dVar18 != 0.0) || (NAN(dVar18))) || (dVar19 != 0.0)) ||
                  ((NAN(dVar19) || (dVar22 != 0.0)))) ||
                 ((NAN(dVar22) || ((edge != 0.0 || (NAN(edge))))))) {
                ccn._2_8_ = LineIntersectPlane((vec3_t *)(line[1] + 2),(vec3_t *)&lon_d);
                *(undefined8 *)
                 ((long)tr[2][2] + (long)(demFileIndex_i * (int)topleftlat + demFileIndex_j) * 8) =
                     ccn._2_8_;
                if (0.0 < (double)ccn._2_8_) {
                  bVar3 = false;
                }
              }
            }
          }
          if (!bVar3) {
            std::__cxx11::string::string
                      ((string *)(fileName.field_2._M_local_buf + 8),
                       (string *)(inputdir.field_2._M_local_buf + 8));
            sprintf((char *)((long)&fp + 6),"%d",(ulong)(uint)topleftlon);
            std::__cxx11::string::append(fileName.field_2._M_local_buf + 8);
            pcVar14 = (char *)std::__cxx11::string::c_str();
            mkdir(pcVar14,0x1c0);
            sprintf((char *)((long)&fp + 6),"%d",(ulong)uStack_1f3c);
            pcVar14 = (char *)std::__cxx11::string::append(fileName.field_2._M_local_buf + 8);
            std::__cxx11::string::append(pcVar14);
            pcVar14 = (char *)std::__cxx11::string::c_str();
            mkdir(pcVar14,0x1c0);
            std::__cxx11::string::string
                      ((string *)&quadHeightData_fl,(string *)(fileName.field_2._M_local_buf + 8));
            std::__cxx11::string::append((char *)&quadHeightData_fl);
            sprintf((char *)((long)&fp + 6),"%d",(ulong)(uint)i);
            pcVar14 = (char *)std::__cxx11::string::append((char *)&quadHeightData_fl);
            std::__cxx11::string::append(pcVar14);
            poVar13 = std::operator<<((ostream *)&std::cout,"droping: ");
            poVar13 = std::operator<<(poVar13,(string *)&quadHeightData_fl);
            std::operator<<(poVar13,"\n");
            pcVar14 = (char *)std::__cxx11::string::c_str();
            __s = fopen(pcVar14,"wb");
            if (__s == (FILE *)0x0) {
              argv_local._4_4_ = 1;
              bVar3 = true;
            }
            else {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (long)iVar7;
              uVar15 = SUB168(auVar2 * ZEXT816(4),0);
              if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
                uVar15 = 0xffffffffffffffff;
              }
              __ptr = operator_new__(uVar15);
              for (local_201c = 0; local_201c < iVar7; local_201c = local_201c + 1) {
                *(float *)((long)__ptr + (long)local_201c * 4) =
                     (float)*(double *)((long)tr[2][2] + (long)local_201c * 8);
              }
              fwrite(__ptr,4,(long)iVar7,__s);
              if (__ptr != (void *)0x0) {
                operator_delete__(__ptr);
              }
              fclose(__s);
              bVar3 = false;
            }
            std::__cxx11::string::~string((string *)&quadHeightData_fl);
            std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
            if (bVar3) goto LAB_00106106;
          }
        }
      }
    }
    if (tr[2][2] != 0.0) {
      operator_delete__((void *)tr[2][2]);
    }
    argv_local._4_4_ = 0;
  }
  else {
    pcVar14 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b30,pcVar14,&local_1b31);
    memset(&local_1de0,0,0x2a8);
    clipp::doc_formatting::doc_formatting(&local_1de0);
    clipp::make_man_page(&local_1b10,(group *)local_110,&local_1b30,&local_1de0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e00,"DESCRIPTION",&local_1e01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e28,
               "    This tools generates ddm file for openglobus.org \n    It needs data from  \n    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n    it is based on the fallowing project: \n    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
               ,(allocator<char> *)((long)&qn_start + 3));
    man = clipp::man_page::prepend_section(&local_1b10,&local_1e00,&local_1e28);
    clipp::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,man);
    std::__cxx11::string::~string((string *)&local_1e28);
    std::allocator<char>::~allocator((allocator<char> *)((long)&qn_start + 3));
    std::__cxx11::string::~string((string *)&local_1e00);
    std::allocator<char>::~allocator(&local_1e01);
    clipp::man_page::~man_page(&local_1b10);
    clipp::doc_formatting::~doc_formatting(&local_1de0);
    std::__cxx11::string::~string((string *)&local_1b30);
    std::allocator<char>::~allocator(&local_1b31);
    argv_local._4_4_ = 0;
  }
LAB_00106106:
  clipp::group::~group((group *)local_110);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_88);
  std::__cxx11::string::~string((string *)&quadSize);
  std::__cxx11::string::~string((string *)(inputdir.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]){
	std::string outputdir;
	std::string inputdir;
	int zoom = 11;
	int quadSize = 33;
	float topleftlon = -180;
	float topleftlat = 85;
	float bottomrightlon = 180;
	float bottomrightlat = 0;
	std::vector<float> bottomrightlonlat{180, 0};
	vec_t incLat_merc, incLon_merc;

	auto cli = (
		required("-o", "--outputdir").doc("output directory root") \
		& value("outputdir", outputdir),
		required("-i", "--inputdir").doc("input directory containing hgt files from \
			http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm") \
		& value("inputdir", inputdir),
		option("-z", "--zoomlevel").doc("target zoom level") \
		& value("zoom", zoom),
		option("-s", "--start").doc("Start lon lat coordonates") \
		& value("lon", topleftlon) & value("lat", topleftlat),
		option("-e", "--end").doc("End lon lat coordonates") \
		& value("lon", bottomrightlon) & value("lat", bottomrightlat),
		option("-x", "--quadsize").doc("Quadsize resolution default 33") \
		& value("size", quadSize)
		);

	if (!parse(argc, argv, cli)) {
		std::cout << make_man_page(cli, argv[0])\
			.prepend_section("DESCRIPTION", 
                "    This tools generates ddm file for openglobus.org \n"
				"    It needs data from  \n"
				"    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n"
				"    it is based on the fallowing project: \n"
				"    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
			    "");
		return 0;
	}

	std::cout << "zoom: " << zoom << "\n";
	std::cout << "topleftlonlat: " << topleftlon << "|" << topleftlat << "\n";
	std::cout << "bottomrightlonlat: " << bottomrightlon << "|" << bottomrightlat << "\n";
	std::cout << "quadsize: " << quadSize << "\n";

	int qn_start = Lon2Merc(topleftlon);
	int qn_end = Lon2Merc(bottomrightlon);
	int qm_start = Lat2Merc(topleftlat);
	int qm_end = Lat2Merc(bottomrightlat);

	int quadsCount = pow(2, zoom); //(dstFieldSize - 1) / 32;
	const int dstFieldSize = quadsCount * (quadSize - 1) + 1;//524289;// = 2^19 + 1 > 1201 * 360 - (360 - 1)
	incLat_merc = incLon_merc = 2.0 * POLE / (vec_t)(dstFieldSize - 1);

	int qm_start_in_grid = (POLE - qm_start) / (incLat_merc * (quadSize - 1));
	int qm_end_in_grid = (POLE - qm_end) / (incLat_merc * (quadSize - 1));
	int qn_start_in_grid = (qn_start - POLE) / (incLon_merc * (quadSize - 1));
	int qn_end_in_grid = (qn_end - POLE) / (incLon_merc * (quadSize - 1));

	std::cout << "qm_start_in_grid: " << qm_start_in_grid << "<->" << qm_end_in_grid << "\n";
	std::cout << "qn_start_in_grid: " << qn_start_in_grid << "<->" << qn_end_in_grid << "\n";

	HgtFilesGrid* demGrid = new HgtFilesGrid();
	
	demGrid->Init(4, inputdir.c_str());
	
	HgtFormat srcHgtFormat(1201, 1201, 1.0 / 1200.0);// 3 / 3600 == 1 / ( 1201 - 1 ) deg.
	HgtFormat srcField(srcHgtFormat.nrows * 180 - (180 - 1), srcHgtFormat.ncols * 360 - (360 - 1));
	HgtFormat dstField(dstFieldSize, dstFieldSize);

	int quadSize2 = quadSize * quadSize;
	vec_t* quadHeightData = new vec_t[quadSize2];

	vec3_t tr[3];
	vec3_t line[2];
	vecSet(line[0], 0.0, 1000000.0, 0.0);
	vecSet(line[1], 0.0, -1000000.0, 0.0);
	//LogAll("Adaptation prepared to proceed...\n");

	double lon_d = 0, lat_d = 0;
	double coordi = 0, coordj = 0;

	for (int qm = 0; qm < quadsCount; qm++) {

		if (qm >= qm_start_in_grid && qm <= qm_end_in_grid) {
			std::cout << qm << "/" << quadsCount << "\n";
			for (int qn = 0; qn < quadsCount; qn++)
			{
				bool isZeroHeight = true;
				//std::cout << "    " << quadsCount << "/" << qn << "\n";
				for (int i = 0; i < quadSize; i++) {
					//std::cout << i << "/" << quadSize << "\n";
					for (int j = 0; j < quadSize; j++) {
						coordi = POLE - ((quadSize - 1) * qm + i) * incLat_merc;
						coordj = (-1) * POLE + ((quadSize - 1) * qn + j) * incLon_merc;

						lat_d = Merc2Lat(coordi);
						lon_d = Merc2Lon(coordj);
						//int test = 100000 % (i+1);
						//std::cout << "    " << test << "\n";
						if (qn == 0 && i == 0 && j == 0 ||
							qn == quadsCount - 1 && i == quadSize - 1 && j == quadSize - 1
							) {
							std::cout << "    lon: " << lon_d << " lat: " << lat_d << "\n";
						}

						int demFileIndex_i = (int)ceil(90.0 - lat_d);
						int demFileIndex_j = (int)floor(180.0 + lon_d);

						vec_t onedlat = DegTail(lat_d);
						vec_t onedlon = DegTail(lon_d);

						int indLat = (int)floor(onedlat / srcHgtFormat.cellsize);
						int i00 = 1200 - 1 - indLat;
						int j00 = (int)floor(onedlon / srcHgtFormat.cellsize);

						vec_t h00 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00);
						vec_t h01 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00 + 1);
						vec_t h10 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00);

						vec_t cornerLat = 90 - demFileIndex_i;
						vec_t cornerLon = -180 + demFileIndex_j;

						vecSet(tr[0],
							cornerLon + j00 * srcHgtFormat.cellsize,
							h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[2],
							cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
							j00 < srcHgtFormat.ncols - 1 ? h01 : h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[1],
							cornerLon + j00 * srcHgtFormat.cellsize,
							i00 < srcHgtFormat.nrows - 1 ? h10 : h00,
							cornerLat + indLat * srcHgtFormat.cellsize);

						line[0][X] = line[1][X] = lon_d;
						line[0][Z] = line[1][Z] = lat_d;

						vec_t h11 = 0;

						vec_t edge = ((line[0][X] - tr[2][X]) * (tr[1][Z] - tr[2][Z]) - (line[0][Z] - tr[2][Z]) * (tr[1][X] - tr[2][X]));

						if (edge < 0.0)
						{
							h11 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00 + 1);

							vecSet(tr[0],
								cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
								i00 < srcHgtFormat.nrows - 1 && j00 < srcHgtFormat.ncols - 1 ? h11 :
								i00 < srcHgtFormat.nrows - 1 ? h10 :
								j00 < srcHgtFormat.nrows - 1 ? h01 :
								h00,
								cornerLat + indLat * srcHgtFormat.cellsize);
						}

						quadHeightData[i * quadSize + j] = 0;

						if (h00 != 0 || h01 != 0 || h10 != 0 || h11 != 0) {
							vec_t h = LineIntersectPlane(tr, line);
							quadHeightData[i * quadSize + j] = h;
							if (h > 0)
								isZeroHeight = false;
						}
					}
				}


				if (!isZeroHeight) {
					//std::cout << "    isZeroHeight : " << isZeroHeight << "\n";
					//std::cout << qm << "\n";
					char ccn[10];
					FILE* fp;

					std::string zoomDir(outputdir);
					sprintf(ccn, "%d", zoom);
					zoomDir.append(ccn);

					mkdir(zoomDir.c_str(), S_IRWXU);

					sprintf(ccn, "%d", qm);
					mkdir(zoomDir.append("/").append(ccn).c_str(), S_IRWXU);

					std::string fileName(zoomDir);
					fileName.append("/");
					sprintf(ccn, "%d", qn);
					fileName.append(ccn).append(".ddm");

					std::cout << "droping: " << fileName << "\n";
					fp = fopen(fileName.c_str(), "wb");

					if (fp == NULL) {
						//LogAll(std::string("Error: ").append(fileName).append("\n").c_str());
						return 1;
					}
					else {
						//LogAll(fileName.append("\n").c_str());
					}

					float* quadHeightData_fl = new float[quadSize2];
					for (int i = 0; i < quadSize2; i++) {
						quadHeightData_fl[i] = quadHeightData[i];
					}

					fwrite(quadHeightData_fl, sizeof(float), quadSize2, fp);
					delete[] quadHeightData_fl;
					fclose(fp);
				}

			}
		}
	}

	delete[] quadHeightData;
    return 0;    
}